

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O3

void duckdb::BaseModeFunction<duckdb::ModeStandard<long>>::
     Execute<long,duckdb::ModeState<long,duckdb::ModeStandard<long>>,duckdb::ModeFunction<duckdb::ModeStandard<long>>>
               (ModeState<long,_duckdb::ModeStandard<long>_> *state,long *key,
               AggregateInputData *input_data)

{
  ulong uVar1;
  _Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this;
  mapped_type *pmVar2;
  ulong uVar3;
  
  this = (_Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          *)state->frequency_map;
  if (this == (_Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)0x0) {
    this = (_Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)operator_new(0x38);
    *(long *)(this + 0x20) = 0;
    *(size_t *)(this + 0x28) = 0;
    *(_Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      **)this = this + 0x30;
    *(size_type *)(this + 8) = 1;
    *(_Hash_node_base **)(this + 0x10) = (_Hash_node_base *)0x0;
    *(size_type *)(this + 0x18) = 0;
    *(undefined4 *)(this + 0x20) = 0x3f800000;
    *(size_t *)(this + 0x28) = 0;
    *(__node_base_ptr *)(this + 0x30) = (__node_base_ptr)0x0;
    state->frequency_map = (Counts *)this;
  }
  pmVar2 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this,key);
  pmVar2->count = pmVar2->count + 1;
  uVar1 = state->count;
  uVar3 = pmVar2->first_row;
  if (uVar1 <= pmVar2->first_row) {
    uVar3 = uVar1;
  }
  pmVar2->first_row = uVar3;
  state->count = uVar1 + 1;
  return;
}

Assistant:

static void Execute(STATE &state, const INPUT_TYPE &key, AggregateInputData &input_data) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(input_data.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		++i.count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		++state.count;
	}